

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  options option_00;
  int iVar1;
  times *ptVar2;
  confirm *pcVar3;
  tms *__buffer;
  int in_R8D;
  lest *this;
  tms *specification_00;
  options option;
  texts in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  undefined1 local_198 [16];
  pointer pbStack_188;
  _Base_ptr local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  _Alloc_hider local_170;
  size_t local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  pointer local_150;
  pointer pbStack_148;
  pointer local_140;
  undefined8 uStack_138;
  undefined1 local_128 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_110;
  undefined1 local_f8 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_e0;
  undefined1 local_c8 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_b0;
  undefined1 local_98 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_80;
  undefined1 local_68 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_50;
  texts *local_38;
  options *local_30;
  
  option.lexical = false;
  option.random = false;
  option.verbose = false;
  option.version = false;
  option.repeat = 1;
  option.help = false;
  option.abort = false;
  option.count = false;
  option.list = false;
  option.tags = false;
  option.time = false;
  option.pass = false;
  option.zen = false;
  option.seed = 0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,arguments);
  split_arguments((tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_198,&local_1b0);
  local_38 = &in;
  local_30 = &option;
  std::tuple<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
  ::operator=((tuple<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
               *)&local_38,
              (tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  if (option.lexical == true) {
    sort(specification);
  }
  if (option.random == true) {
    option_00.lexical = option.lexical;
    option_00.random = option.random;
    option_00.verbose = option.verbose;
    option_00.version = option.version;
    option_00.repeat = option.repeat;
    option_00.help = option.help;
    option_00.abort = option.abort;
    option_00.count = option.count;
    option_00.list = option.list;
    option_00.tags = option.tags;
    option_00.time = option.time;
    option_00.pass = option.pass;
    option_00.zen = option.zen;
    option_00.seed = option.seed;
    shuffle(specification,option_00);
  }
  if (option.help == true) {
    iVar1 = usage(os);
    goto LAB_00105405;
  }
  if (option.version == true) {
    iVar1 = version(os);
    goto LAB_00105405;
  }
  if (option.count == true) {
    std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_50,specification);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,&in);
    local_198._8_8_ = (ulong)(uint)local_198._12_4_ << 0x20;
    this = (lest *)&local_50;
    specification_00 = (tms *)local_68;
    local_198._0_8_ = os;
    for_test<lest::count>(this,(tests *)specification_00,(texts *)local_198,(count *)0x1,in_R8D);
    count::~count((count *)local_198);
LAB_001053f3:
    iVar1 = 0;
  }
  else {
    if (option.list == true) {
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_80,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98,&in);
      this = (lest *)&local_80;
      specification_00 = (tms *)local_98;
      local_198._0_8_ = os;
      for_test<lest::print>(this,(tests *)specification_00,(texts *)local_198,(print *)0x1,in_R8D);
      goto LAB_001053f3;
    }
    if (option.tags == true) {
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_b0,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,&in);
      local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_198 + 0x10);
      local_198._8_8_ = (pointer)0x0;
      pbStack_188 = (pointer)0x0;
      local_180 = (_Base_ptr)0x0;
      local_168 = 0;
      this = (lest *)&local_b0;
      specification_00 = (tms *)local_c8;
      local_198._0_8_ = os;
      local_170._M_p = (pointer)local_178;
      for_test<lest::ptags>(this,(tests *)specification_00,(texts *)local_198,(ptags *)0x1,in_R8D);
      ptags::~ptags((ptags *)local_198);
      goto LAB_001053f3;
    }
    if (option.time == true) {
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_e0,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f8,&in);
      times::times((times *)local_198,(tms *)os);
      this = (lest *)&local_e0;
      specification_00 = (tms *)local_f8;
      __buffer = specification_00;
      ptVar2 = for_test<lest::times>
                         (this,(tests *)specification_00,(texts *)local_198,(times *)0x1,in_R8D);
      iVar1 = ptVar2->failures;
      times::~times((times *)local_198,__buffer);
    }
    else {
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_110,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128,&in);
      local_170._M_p = (pointer)&local_160;
      local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)option.seed;
      pbStack_188 = (pointer)option._0_8_;
      local_180 = (_Base_ptr)option._8_8_;
      local_168 = 0;
      local_160._M_local_buf[0] = '\0';
      local_150 = (pointer)0x0;
      pbStack_148 = (pointer)0x0;
      local_140 = (pointer)0x0;
      uStack_138._0_4_ = 0;
      uStack_138._4_4_ = 0;
      this = (lest *)&local_110;
      specification_00 = (tms *)local_128;
      local_198._0_8_ = os;
      local_198._8_8_ = os;
      pcVar3 = for_test<lest::confirm>
                         (this,(tests *)specification_00,(texts *)local_198,
                          (confirm *)((ulong)option._8_8_ >> 0x20),in_R8D);
      iVar1 = pcVar3->failures;
      confirm::~confirm((confirm *)local_198);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)specification_00);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector
            ((vector<lest::test,_std::allocator<lest::test>_> *)this);
LAB_00105405:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&in);
  return iVar1;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        std::tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage   ( os ); }
        if ( option.version ) { return version ( os ); }
        if ( option.count   ) { return for_test( specification, in, count( os ) ); }
        if ( option.list    ) { return for_test( specification, in, print( os ) ); }
        if ( option.tags    ) { return for_test( specification, in, ptags( os ) ); }
        if ( option.time    ) { return for_test( specification, in, times( os, option ) ); }

        return for_test( specification, in, confirm( os, option ), option.repeat );
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}